

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  string *psVar1;
  MethodOptions *pMVar2;
  MethodOptions *pMVar3;
  
  MethodDescriptorProto::set_name(proto,*(string **)this);
  if (*(char *)(*(long *)(this + 0x18) + 0x29) == '\0') {
    MethodDescriptorProto::set_input_type(proto,".");
  }
  psVar1 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(proto);
  std::__cxx11::string::append((string *)psVar1);
  if (*(char *)(*(long *)(this + 0x20) + 0x29) == '\0') {
    MethodDescriptorProto::set_output_type(proto,".");
  }
  psVar1 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(proto);
  std::__cxx11::string::append((string *)psVar1);
  pMVar3 = *(MethodOptions **)(this + 0x28);
  pMVar2 = MethodOptions::default_instance();
  if (pMVar3 != pMVar2) {
    pMVar3 = MethodDescriptorProto::mutable_options(proto);
    MethodOptions::CopyFrom(pMVar3,*(MethodOptions **)(this + 0x28));
    return;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}